

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

int evfilt_signal_knote_delete(filter *filt,knote *kn)

{
  int iVar1;
  int iVar2;
  
  iVar2 = (kn->field_10).kn_timerfd;
  if (iVar2 == -1) {
    iVar1 = 0;
  }
  else {
    iVar1 = epoll_ctl(filt->kf_kqueue->epollfd,2,iVar2,(epoll_event *)0x0);
    iVar2 = close(iVar2);
    if (iVar2 < 0) {
      iVar1 = -1;
    }
    else {
      (kn->field_10).kn_timerfd = -1;
    }
  }
  return iVar1;
}

Assistant:

int
evfilt_signal_knote_delete(struct filter *filt, struct knote *kn)
{
    const int sigfd = kn->kn_signalfd;
    int       rv = 0;

    /* Needed so that delete() can be called after disable() */
    if (kn->kn_signalfd == -1)
        return (0);

    rv = epoll_ctl(filter_epoll_fd(filt), EPOLL_CTL_DEL, sigfd, NULL);
    if (rv < 0) {
        dbg_perror("epoll_ctl(2)");
    } else {
        dbg_printf("sig_fd=%i - removed from epoll_fd=%i", sigfd, filter_epoll_fd(filt));
    }

    dbg_printf("sig_fd=%d - closed", sigfd);
    if (close(sigfd) < 0) {
        dbg_perror("close(2)");
        return (-1);
    }

    /* NOTE: This does not call sigprocmask(3) to unblock the signal. */
    kn->kn_signalfd = -1;

    return (rv);
}